

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void raviX_ptrlist_remove_all(PtrList **self)

{
  C_MemoryAllocator *pCVar1;
  C_MemoryAllocator *alloc;
  PtrList *list;
  PtrList *tmp;
  PtrList **self_local;
  
  alloc = (C_MemoryAllocator *)*self;
  if ((PtrList *)alloc != (PtrList *)0x0) {
    ((PtrList *)alloc)->prev_->next_ = (PtrList *)0x0;
    while (alloc != (C_MemoryAllocator *)0x0) {
      pCVar1 = (C_MemoryAllocator *)alloc->calloc;
      (**(code **)(alloc->free + 0x18))(*(undefined8 *)alloc->free,alloc);
      alloc = pCVar1;
    }
    *self = (PtrList *)0x0;
  }
  return;
}

Assistant:

void raviX_ptrlist_remove_all(PtrList **self)
{
	PtrList *tmp, *list = *self;
	if (!list)
		return;
	list->prev_->next_ = NULL;
	while (list) {
		tmp = list;
		list = list->next_;
		C_MemoryAllocator *alloc = tmp->allocator_;
		alloc->free(alloc->arena, tmp);
	}
	*self = NULL;
}